

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O2

void __thiscall SerializeSpan_Write_Test::TestBody(SerializeSpan_Write_Test *this)

{
  Clause CVar1;
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_00;
  _func_int **pp_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_01;
  TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
  *this_02;
  UntypedActionResultHolderBase *f;
  ActionResultHolder<pstore::serialize::archive::void_type> *pAVar4;
  char *in_RCX;
  int line;
  int line_00;
  char *in_R8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  allocator local_149;
  undefined1 local_148 [32];
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  array<(anonymous_namespace)::SerializeSpan::simple_struct,_2UL> my;
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
  local_100;
  ReturnAction<pstore::serialize::archive::void_type> local_e8;
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_> local_d8
  ;
  mock_span_archive arch;
  
  anon_unknown.dwarf_62afb::SerializeSpan::mock_span_archive::mock_span_archive(&arch);
  local_d8.vtable_ =
       (VTable *)
       testing::internal::
       MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_d8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001870d8;
  anon_unknown.dwarf_62afb::SerializeSpan::mock_span_archive::gmock_writen
            ((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
              *)&my,&arch,
             (Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
              *)&local_d8);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::
            MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
            ::InternalExpectedAt
                      ((MockSpec<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
                        *)&my,(char *)0xc0,line,in_RCX,in_R8);
  testing::internal::
  TypedExpectation<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::Times(this_00,1);
  testing::internal::ReturnAction<pstore::serialize::archive::void_type>::ReturnAction(&local_e8);
  pp_Var2 = (_func_int **)operator_new(0x10);
  *pp_Var2 = (_func_int *)&PTR__ActionInterface_00187718;
  local_148._0_8_ = pp_Var2;
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00187768;
  p_Var3[1]._vptr__Sp_counted_base = pp_Var2;
  local_128._M_unused._M_object = (void *)0x0;
  local_128._8_8_ = 0;
  local_118 = (code *)0x0;
  pcStack_110 = (code *)0x0;
  local_148._8_8_ = p_Var3;
  local_128._M_unused._M_object = operator_new(0x10);
  *(_func_int ***)local_128._M_unused._0_8_ = pp_Var2;
  local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_128._M_unused._0_8_ + 8) = p_Var3;
  local_148._0_8_ = (pointer)0x0;
  pcStack_110 = std::
                _Function_handler<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>),_testing::Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>::ActionAdapter>
                ::_M_invoke;
  local_118 = std::
              _Function_handler<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>),_testing::Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>::ActionAdapter>
              ::_M_manager;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  CVar1 = (this_00->super_ExpectationBase).last_clause_;
  std::__cxx11::string::string
            ((string *)local_148,
             ".WillOnce() cannot appear after .WillRepeatedly() or .RetiresOnSaturation().",
             &local_149);
  testing::internal::ExpectationBase::ExpectSpecProperty
            (&this_00->super_ExpectationBase,(int)CVar1 < 6,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  (this_00->super_ExpectationBase).last_clause_ = kWillOnce;
  this_01 = (Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
             *)operator_new(0x20);
  testing::
  Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::Action(this_01,(Action<pstore::serialize::archive::void_type_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
                    *)&local_128);
  local_148._0_8_ = this_01;
  std::vector<void_const*,std::allocator<void_const*>>::emplace_back<void_const*>
            ((vector<void_const*,std::allocator<void_const*>> *)
             &(this_00->super_ExpectationBase).untyped_actions_,(void **)local_148);
  if ((this_00->super_ExpectationBase).cardinality_specified_ == false) {
    testing::Exactly((testing *)local_148,
                     (int)((ulong)((long)(this_00->super_ExpectationBase).untyped_actions_.
                                         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->super_ExpectationBase).untyped_actions_.
                                        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
    std::__shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2> *)
               &(this_00->super_ExpectationBase).cardinality_,
               (__shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2> *)
               local_148);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8));
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.value_.
              super___shared_ptr<pstore::serialize::archive::void_type,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  testing::internal::
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~MatcherBase(&local_100);
  testing::internal::
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~MatcherBase(&local_d8);
  local_100.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)
       testing::internal::
       MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  my._M_elems = (_Type)&PTR__MatcherBase_001870d8;
  anon_unknown.dwarf_62afb::SerializeSpan::mock_span_archive::gmock_readn
            ((MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
              *)local_148,&arch,
             (Matcher<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
              *)&my);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::
            MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
            ::InternalExpectedAt
                      ((MockSpec<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>)>
                        *)local_148,(char *)0xc1,line_00,in_RCX,in_R8);
  testing::internal::
  TypedExpectation<void_(pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>)>
  ::Times(this_02,0);
  testing::internal::
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~MatcherBase((MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
                *)(local_148 + 8));
  testing::internal::
  MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,_-1L>_>::
  ~MatcherBase((MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_>
                *)&my);
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            ((UntypedFunctionMockerBase *)&arch,&arch,"writen");
  local_148._0_8_ = (pointer)0x2;
  local_148._8_8_ =
       (MatcherBase<pstore::gsl::span<(anonymous_namespace)::SerializeSpan::simple_struct,__1L>_> *)
       &my;
  f = testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
                ((UntypedFunctionMockerBase *)&arch,local_148);
  pAVar4 = testing::internal::
           DownCast_<testing::internal::ActionResultHolder<pstore::serialize::archive::void_type>*,testing::internal::UntypedActionResultHolderBase>
                     (f);
  if (pAVar4 != (ActionResultHolder<pstore::serialize::archive::void_type> *)0x0) {
    (*(pAVar4->super_UntypedActionResultHolderBase)._vptr_UntypedActionResultHolderBase[1])(pAVar4);
  }
  anon_unknown.dwarf_62afb::SerializeSpan::mock_span_archive::~mock_span_archive(&arch);
  return;
}

Assistant:

TEST_F (SerializeSpan, Write) {
    using ::testing::_;
    using ::testing::Return;

    SerializeSpan::mock_span_archive arch;

    auto const ret = pstore::serialize::archive::void_type{};
    EXPECT_CALL (arch, writen (_)).Times (1).WillOnce (Return (ret));
    EXPECT_CALL (arch, readn (_)).Times (0);

    std::array<simple_struct, 2> my;
    ::pstore::gsl::span<simple_struct> span{my};
    pstore::serialize::write (arch, span);
}